

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O2

void __thiscall
CMU462::DynamicScene::Scene::render_splines_at
          (Scene *this,double time,bool pretty,bool useCapsuleRadius)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  long lVar3;
  long *plVar4;
  _Rb_tree_node_base *p_Var5;
  Mesh *this_00;
  _Rb_tree_node_base *p_Var6;
  _Base_ptr p_Var7;
  iterator __begin2;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  GLfloat white [4];
  
  p_Var1 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (p_Var5 = p_Var6; (_Rb_tree_header *)p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    lVar2 = *(long *)(p_Var5 + 1);
    uVar8 = 0;
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    uVar13 = 0;
    uVar14 = 0;
    uVar15 = 0;
    uVar16 = 0;
    uVar17 = 0;
    if (*(long *)(lVar2 + 0x80) != 0) {
      lVar3 = *(long *)(lVar2 + 0x70);
      uVar14 = *(undefined4 *)(lVar3 + 0x28);
      uVar15 = *(undefined4 *)(lVar3 + 0x2c);
      uVar16 = *(undefined4 *)(lVar3 + 0x30);
      uVar17 = *(undefined4 *)(lVar3 + 0x34);
      uVar13 = *(undefined8 *)(lVar3 + 0x38);
    }
    *(undefined4 *)(lVar2 + 0x10) = uVar14;
    *(undefined4 *)(lVar2 + 0x14) = uVar15;
    *(undefined4 *)(lVar2 + 0x18) = uVar16;
    *(undefined4 *)(lVar2 + 0x1c) = uVar17;
    *(undefined8 *)(lVar2 + 0x20) = uVar13;
    if (*(long *)(lVar2 + 0xb0) != 0) {
      lVar3 = *(long *)(lVar2 + 0xa0);
      uVar8 = *(undefined4 *)(lVar3 + 0x28);
      uVar9 = *(undefined4 *)(lVar3 + 0x2c);
      uVar10 = *(undefined4 *)(lVar3 + 0x30);
      uVar11 = *(undefined4 *)(lVar3 + 0x34);
      uVar12 = *(undefined8 *)(lVar3 + 0x38);
    }
    *(undefined4 *)(lVar2 + 0x28) = uVar8;
    *(undefined4 *)(lVar2 + 0x2c) = uVar9;
    *(undefined4 *)(lVar2 + 0x30) = uVar10;
    *(undefined4 *)(lVar2 + 0x34) = uVar11;
    *(undefined8 *)(lVar2 + 0x38) = uVar12;
    if (*(long *)(lVar2 + 0xe0) == 0) {
      uVar14 = 0;
      uVar15 = 0;
      uVar16 = 0;
      uVar17 = 0;
      uVar13 = 0;
    }
    else {
      lVar3 = *(long *)(lVar2 + 0xd0);
      uVar14 = *(undefined4 *)(lVar3 + 0x28);
      uVar15 = *(undefined4 *)(lVar3 + 0x2c);
      uVar16 = *(undefined4 *)(lVar3 + 0x30);
      uVar17 = *(undefined4 *)(lVar3 + 0x34);
      uVar13 = *(undefined8 *)(lVar3 + 0x38);
    }
    *(undefined4 *)(lVar2 + 0x40) = uVar14;
    *(undefined4 *)(lVar2 + 0x44) = uVar15;
    *(undefined4 *)(lVar2 + 0x48) = uVar16;
    *(undefined4 *)(lVar2 + 0x4c) = uVar17;
    *(undefined8 *)(lVar2 + 0x50) = uVar13;
  }
  for (; (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    if ((*(long *)(p_Var6 + 1) != 0) &&
       (this_00 = (Mesh *)__dynamic_cast(*(long *)(p_Var6 + 1),&SceneObject::typeinfo,
                                         &Mesh::typeinfo,0), this_00 != (Mesh *)0x0)) {
      Mesh::linearBlendSkinning(this_00,useCapsuleRadius);
    }
  }
  for (p_Var7 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var7 != p_Var1; p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
    plVar4 = *(long **)(p_Var7 + 1);
    white[0] = 1.0;
    white[1] = 1.0;
    white[2] = 1.0;
    white[3] = 1.0;
    if ((char)plVar4[0x1d] == '\x01') {
      if (*(char *)((long)plVar4 + 0xe9) == '\0') {
        if (pretty) {
          (**(code **)(*plVar4 + 0x10))();
        }
        else {
          (**(code **)(*plVar4 + 8))(plVar4);
        }
      }
      else {
        glEnable(0xbc0);
        glAlphaFunc(0x3f800000,0x206);
        (**(code **)(*plVar4 + 0x18))(plVar4);
        glDisable(0xbc0);
      }
    }
    glLightfv(0x4000,0x1201,white);
  }
  for (p_Var6 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var6 != p_Var1;
      p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
    plVar4 = *(long **)(p_Var6 + 1);
    if (((char)plVar4[0x1d] == '\x01') && (*(char *)((long)plVar4 + 0xe9) == '\x01')) {
      glEnable(0xbc0);
      glAlphaFunc(0x3f800000,0x201);
      glDepthMask(0);
      (**(code **)(*plVar4 + 0x18))(plVar4);
      glDisable(0xbc0);
      glDepthMask(1);
    }
  }
  return;
}

Assistant:

void Scene::render_splines_at(double time, bool pretty, bool useCapsuleRadius)
{
  // Update splines
  for (SceneObject *obj : objects)
  {
    obj->position = obj->positions.evaluate(time);
    obj->rotation = obj->rotations.evaluate(time);
    obj->scale = obj->scales.evaluate(time);
  }

  // Perform linear blend skinning before rendering
  for (SceneObject *obj : objects)
  {
    Mesh* mesh = dynamic_cast<Mesh*>(obj);
    if (mesh != nullptr)
    {
      mesh->linearBlendSkinning(useCapsuleRadius);
    }
  }
  
  // draw the scene twice using alpha test
  for (SceneObject *obj : objects)
  {
    GLfloat white[4] = { 1., 1., 1., 1. };
    if (obj->isVisible && !obj->isGhosted)
    {
      (pretty) ? (obj->draw_pretty()) : (obj->draw());
    }
    else if (obj->isVisible && obj->isGhosted)
    {
      glEnable(GL_ALPHA_TEST);
      glAlphaFunc(GL_GEQUAL, 1);
      obj->drawGhost();
      glDisable(GL_ALPHA_TEST);
    }
    glLightfv(GL_LIGHT0, GL_DIFFUSE, white);
  }

  for (SceneObject *obj : objects)
  {
    if (obj->isVisible && obj->isGhosted)
    {
      glEnable(GL_ALPHA_TEST);
      glAlphaFunc(GL_LESS, 1);
      glDepthMask(GL_FALSE);
      obj->drawGhost();
      glDisable(GL_ALPHA_TEST);
      glDepthMask(GL_TRUE);
    }
  }
}